

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O2

void __thiscall SQFunctionProto::SQFunctionProto(SQFunctionProto *this,SQSharedState *ss)

{
  (this->super_SQCollectable).super_SQRefCounted._uiRef = 0;
  (this->super_SQCollectable).super_SQRefCounted._weakref = (SQWeakRef *)0x0;
  (this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQFunctionProto_00144098;
  (this->_sourcename).super_SQObject._type = OT_NULL;
  (this->_sourcename).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_name).super_SQObject._type = OT_NULL;
  (this->super_SQCollectable)._next = (SQCollectable *)0x0;
  (this->super_SQCollectable)._prev = (SQCollectable *)0x0;
  (this->_name).super_SQObject._unVal.pTable = (SQTable *)0x0;
  this->_stacksize = 0;
  this->_bgenerator = false;
  (this->super_SQCollectable)._sharedstate = ss;
  SQCollectable::AddToChain(&ss->_gc_chain,(SQCollectable_conflict *)this);
  return;
}

Assistant:

SQFunctionProto::SQFunctionProto(SQSharedState *ss)
{
    _stacksize=0;
    _bgenerator=false;
    INIT_CHAIN();ADD_TO_CHAIN(&_ss(this)->_gc_chain,this);
}